

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::prepareGlobals_abi_cxx11_
          (string *__return_storage_ptr__,VaryingLocationsTest *this,GLint last_in_loc,
          GLint last_out_loc)

{
  size_t position;
  GLchar buffer [16];
  size_t local_50;
  GLchar local_48 [24];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "const uint first_input_location  = 0u;\nconst uint first_output_location = 0u;\nconst uint last_input_location   = LAST_INPUTu;\nconst uint last_output_location  = LAST_OUTPUTu;\n"
             ,"");
  local_50 = 100;
  sprintf(local_48,"%d",(ulong)(uint)last_in_loc);
  Utils::replaceToken("LAST_INPUT",&local_50,local_48,__return_storage_ptr__);
  sprintf(local_48,"%d",(ulong)(uint)last_out_loc);
  Utils::replaceToken("LAST_OUTPUT",&local_50,local_48,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingLocationsTest::prepareGlobals(GLint last_in_loc, GLint last_out_loc)
{
	GLchar		buffer[16];
	std::string globals = "const uint first_input_location  = 0u;\n"
						  "const uint first_output_location = 0u;\n"
						  "const uint last_input_location   = LAST_INPUTu;\n"
						  "const uint last_output_location  = LAST_OUTPUTu;\n";
	size_t position = 100; /* Skip first part */

	sprintf(buffer, "%d", last_in_loc);
	Utils::replaceToken("LAST_INPUT", position, buffer, globals);

	sprintf(buffer, "%d", last_out_loc);
	Utils::replaceToken("LAST_OUTPUT", position, buffer, globals);

	return globals;
}